

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btTriangle>::~btAlignedObjectArray(btAlignedObjectArray<btTriangle> *this)

{
  clear(this);
  return;
}

Assistant:

~btAlignedObjectArray()
		{
			clear();
		}